

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O2

void SUNDlsMat_bandMatvec
               (sunrealtype **a,sunrealtype *x,sunrealtype *y,sunindextype n,sunindextype mu,
               sunindextype ml,sunindextype smu)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_stack_00000008;
  
  lVar3 = 0;
  lVar2 = 0;
  if (0 < n) {
    lVar2 = n;
  }
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    y[lVar3] = 0.0;
  }
  lVar3 = in_stack_00000008 << 3;
  for (lVar5 = 0; lVar5 != lVar2; lVar5 = lVar5 + 1) {
    lVar6 = lVar5 - mu;
    if (lVar5 - mu < 1) {
      lVar6 = 0;
    }
    lVar4 = lVar5 + ml;
    if (n <= lVar5 + ml) {
      lVar4 = n + -1;
    }
    psVar1 = a[lVar5];
    for (; lVar6 <= lVar4; lVar6 = lVar6 + 1) {
      y[lVar6] = *(double *)((long)psVar1 + lVar6 * 8 + lVar3) * x[lVar5] + y[lVar6];
    }
    lVar3 = lVar3 + -8;
  }
  return;
}

Assistant:

void SUNDlsMat_bandMatvec(sunrealtype** a, sunrealtype* x, sunrealtype* y,
                          sunindextype n, sunindextype mu, sunindextype ml,
                          sunindextype smu)
{
  sunindextype i, j, is, ie;
  sunrealtype* col_j;

  for (i = 0; i < n; i++) { y[i] = ZERO; }

  for (j = 0; j < n; j++)
  {
    col_j = a[j] + smu - mu;
    is    = (0 > j - mu) ? 0 : j - mu;
    ie    = (n - 1 < j + ml) ? n - 1 : j + ml;
    for (i = is; i <= ie; i++) { y[i] += col_j[i - j + mu] * x[j]; }
  }
}